

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void * parse_add_sub(Parser *parser)

{
  BinaryExpr *left;
  void *right;
  Token *op;
  
  left = (BinaryExpr *)parse_mul_div(parser);
  op = parser->token;
  while ((op->kind == SUB || (op->kind == ADD))) {
    op = parser->token;
    move(parser);
    right = parse_mul_div(parser);
    left = new_binary_expr(left,op,right);
  }
  return left;
}

Assistant:

void *parse_add_sub(Parser *parser) {
    void *left = parse_mul_div(parser);
    Token *tok = token(parser);
    while (g_kind(tok) == ADD || g_kind(tok) == SUB) {
        tok = token(parser);
        move(parser);
        left = new_binary_expr(left, tok, parse_mul_div(parser));
    }
    return left;
}